

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O1

void __thiscall
XPMP2::RemoteAcDetailTy::RemoteAcDetailTy
          (RemoteAcDetailTy *this,Aircraft *_ac,double _lat,double _lon,float _alt_ft,
          uint16_t _dTime)

{
  memset(this,0,0x120);
  CopyFrom(this,_ac,_lat,_lon,_alt_ft,_dTime);
  return;
}

Assistant:

RemoteAcDetailTy::RemoteAcDetailTy (const Aircraft& _ac,
                                    double _lat, double _lon, float _alt_ft,
                                    std::uint16_t _dTime)
{
    // set everything to zero
    memset(this, 0, sizeof(*this));
    lat = lon = 0.0;
    alt_ft = 0.0f;
    // then copy from a/c
    CopyFrom(_ac, _lat, _lon, _alt_ft, _dTime);
}